

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcConstructionResource::~IfcConstructionResource
          (IfcConstructionResource *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  void *pvVar3;
  pointer pcVar4;
  undefined1 *puVar5;
  
  pvVar3 = *vtt;
  *(void **)this = pvVar3;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar3 + -0x18)) = vtt[0x19];
  *(void **)&this->field_0x88 = vtt[0x1a];
  *(void **)&this->field_0x98 = vtt[0x1b];
  *(void **)&this->field_0xd0 = vtt[0x1c];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).
  _vptr_ObjectHelper = (_func_int **)vtt[0x1d];
  pcVar4 = (this->ResourceConsumption).ptr._M_dataplus._M_p;
  paVar1 = &(this->ResourceConsumption).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->ResourceGroup).ptr._M_dataplus._M_p;
  paVar1 = &(this->ResourceGroup).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  puVar5 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).
             field_0x10;
  puVar2 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).
            field_0x20;
  if (puVar5 != puVar2) {
    operator_delete(puVar5,*(long *)puVar2 + 1);
  }
  pvVar3 = vtt[2];
  *(void **)this = pvVar3;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar3 + -0x18)) = vtt[0xe];
  *(void **)&this->field_0x88 = vtt[0xf];
  *(void **)&this->field_0x98 = vtt[0x10];
  if (*(undefined1 **)&this->field_0xa8 != &this->field_0xb8) {
    operator_delete(*(undefined1 **)&this->field_0xa8,*(long *)&this->field_0xb8 + 1);
  }
  pvVar3 = vtt[4];
  *(void **)this = pvVar3;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar3 + -0x18)) = vtt[7];
  if (*(undefined1 **)&this->field_0x60 != &this->field_0x70) {
    operator_delete(*(undefined1 **)&this->field_0x60,*(long *)&this->field_0x70 + 1);
  }
  if (*(undefined1 **)&this->field_0x38 != &this->field_0x48) {
    operator_delete(*(undefined1 **)&this->field_0x38,*(long *)&this->field_0x48 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
    return;
  }
  return;
}

Assistant:

IfcConstructionResource() : Object("IfcConstructionResource") {}